

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O3

QList<QBenchmarkMeasurerBase::Measurement> * __thiscall
QBenchmarkPerfEventsMeasurer::stop
          (QList<QBenchmarkMeasurerBase::Measurement> *__return_storage_ptr__,
          QBenchmarkPerfEventsMeasurer *this)

{
  longlong lVar1;
  Type *pTVar2;
  Measurement *pMVar3;
  pointer pMVar4;
  ulong idx;
  long lVar5;
  long in_FS_OFFSET;
  Measurement MVar6;
  QArrayData *d;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  prctl(0x1f);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>::instance
                     ();
  lVar1 = (pTVar2->d).size;
  local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pMVar3 = (Measurement *)QArrayData::allocate(&local_40,0x10,0x10,lVar1,KeepSize);
  (__return_storage_ptr__->d).d = (Data *)local_40;
  (__return_storage_ptr__->d).ptr = pMVar3;
  (__return_storage_ptr__->d).size = lVar1;
  if ((pTVar2->d).size != 0) {
    lVar5 = 8;
    idx = 0;
    do {
      MVar6 = readValue(this,idx);
      pMVar4 = QList<QBenchmarkMeasurerBase::Measurement>::data(__return_storage_ptr__);
      *(qreal *)((long)pMVar4 + lVar5 + -8) = MVar6.value;
      *(QBenchmarkMetric *)((long)&pMVar4->value + lVar5) = MVar6.metric;
      idx = idx + 1;
      lVar5 = lVar5 + 0x10;
    } while (idx < (ulong)(pTVar2->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QBenchmarkMeasurerBase::Measurement> QBenchmarkPerfEventsMeasurer::stop()
{
    // disable the counters
    prctl(PR_TASK_PERF_EVENTS_DISABLE);

    const QList<PerfEvent> &counters = *eventTypes;
    QList<Measurement> result(counters.size(), {});
    for (qsizetype i = 0; i < counters.size(); ++i) {
        result[i] = readValue(i);
    }
    return result;
}